

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int xmlFindExtraHandler(char *norig,char *name,int output,xmlCharEncConvImpl impl,void *implCtxt,
                       xmlCharEncodingHandler **out)

{
  xmlCharEncodingHandlerPtr pxVar1;
  int iVar2;
  xmlCharEncodingHandler *handler;
  char *pcVar3;
  code *impl_00;
  long lVar4;
  
  handler = (xmlCharEncodingHandler *)(*xmlMalloc)(0x48);
  if (handler == (xmlCharEncodingHandler *)0x0) {
    iVar2 = 2;
  }
  else {
    handler->outputCtxt = (void *)0x0;
    handler->ctxtDtor = (xmlCharEncConvCtxtDtor)0x0;
    handler->iconv_out = (void *)0x0;
    handler->inputCtxt = (void *)0x0;
    handler->output = (xmlCharEncodingOutputFunc)0x0;
    handler->iconv_in = (void *)0x0;
    handler->name = (char *)0x0;
    handler->input = (xmlCharEncodingInputFunc)0x0;
    *(undefined8 *)&handler->flags = 0;
    pcVar3 = (*xmlMemStrdup)(name);
    handler->name = pcVar3;
    if (pcVar3 == (char *)0x0) {
      iVar2 = 2;
    }
    else {
      impl_00 = impl;
      if (impl == (xmlCharEncConvImpl)0x0) {
        if (globalHandlers != (xmlCharEncodingHandlerPtr *)0x0) {
          for (lVar4 = 0; lVar4 < nbCharEncodingHandler; lVar4 = lVar4 + 1) {
            pxVar1 = globalHandlers[lVar4];
            iVar2 = xmlStrcasecmp((xmlChar *)name,(xmlChar *)pxVar1->name);
            if ((iVar2 == 0) && ((&pxVar1->input)[output != 0] != (xmlCharEncodingInputFunc)0x0)) {
              *out = pxVar1;
              iVar2 = 0;
              goto LAB_0012c9bb;
            }
          }
        }
        impl_00 = xmlCharEncIconv;
        norig = name;
        implCtxt = handler;
      }
      iVar2 = xmlInvokeConvImpl(impl_00,implCtxt,norig,handler);
      if (iVar2 == 0) {
        *out = handler;
        return 0;
      }
    }
LAB_0012c9bb:
    (*xmlFree)(handler->name);
    (*xmlFree)(handler);
  }
  return iVar2;
}

Assistant:

static int
xmlFindExtraHandler(const char *norig, const char *name, int output,
                    xmlCharEncConvImpl impl, void *implCtxt,
                    xmlCharEncodingHandler **out) {
    xmlCharEncodingHandler *handler;
    int ret;
    int i;

    handler = xmlMalloc(sizeof(*handler));
    if (handler == NULL)
        return(XML_ERR_NO_MEMORY);
    memset(handler, 0, sizeof(*handler));

    handler->name = xmlMemStrdup(name);
    if (handler->name == NULL) {
        ret = XML_ERR_NO_MEMORY;
        goto done;
    }

    /*
     * Try custom implementation before deprecated global handlers.
     *
     * Note that we pass the original name without deprecated
     * alias resolution.
     */
    if (impl != NULL) {
        ret = xmlInvokeConvImpl(impl, implCtxt, norig, handler);
        if (ret != XML_ERR_OK)
            goto done;

        *out = handler;
        return(XML_ERR_OK);
    }

    /*
     * Deprecated
     */
    if (globalHandlers != NULL) {
        for (i = 0; i < nbCharEncodingHandler; i++) {
            xmlCharEncodingHandler *h = globalHandlers[i];

            if (!xmlStrcasecmp((const xmlChar *) name,
                               (const xmlChar *) h->name)) {
                if ((output ? h->output : h->input) != NULL) {
                    *out = h;
                    ret = XML_ERR_OK;
                    goto done;
                }
            }
        }
    }

#ifdef LIBXML_ICONV_ENABLED
    ret = xmlInvokeConvImpl(xmlCharEncIconv, handler, name, handler);
    if (ret == XML_ERR_OK) {
        *out = handler;
        return(XML_ERR_OK);
    }
    if (ret != XML_ERR_UNSUPPORTED_ENCODING)
        goto done;
#endif /* LIBXML_ICONV_ENABLED */

#ifdef LIBXML_ICU_ENABLED
    ret = xmlInvokeConvImpl(xmlCharEncUconv, handler, name, handler);
    if (ret == XML_ERR_OK) {
        *out = handler;
        return(XML_ERR_OK);
    }
    if (ret != XML_ERR_UNSUPPORTED_ENCODING)
        goto done;
#endif /* LIBXML_ICU_ENABLED */

    ret = XML_ERR_UNSUPPORTED_ENCODING;

done:
    if (handler != NULL) {
        xmlFree(handler->name);
        xmlFree(handler);
    }

    return(ret);
}